

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall HighsDomain::markPropagate(HighsDomain *this,HighsInt row)

{
  double dVar1;
  HighsMipSolver *pHVar2;
  pointer pHVar3;
  iterator __position;
  bool bVar4;
  bool bVar5;
  long lVar6;
  pointer puVar7;
  int local_14;
  
  lVar6 = (long)row;
  puVar7 = (this->propagateflags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7[lVar6] != '\0') {
    return;
  }
  pHVar2 = this->mipsolver;
  dVar1 = (pHVar2->model_->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6];
  if ((dVar1 <= -INFINITY) ||
     (((this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar6] == 0 &&
      (pHVar3 = (this->activitymin_).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                ._M_impl.super__Vector_impl_data._M_start,
      dVar1 - ((pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol <=
      pHVar3[lVar6].hi + pHVar3[lVar6].lo)))) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if ((this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] != 1) {
      pHVar3 = (this->activitymax_).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = (pHVar3[lVar6].hi + pHVar3[lVar6].lo) - dVar1 <=
              (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[lVar6];
    }
  }
  dVar1 = (pHVar2->model_->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6];
  if ((INFINITY <= dVar1) ||
     (((this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar6] == 0 &&
      (pHVar3 = (this->activitymax_).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pHVar3[lVar6].hi + pHVar3[lVar6].lo <=
      ((pHVar2->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol + dVar1)))) {
    bVar5 = false;
  }
  else {
    if ((this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] == 1) goto LAB_00294b8e;
    pHVar3 = (this->activitymin_).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar5 = dVar1 - (pHVar3[lVar6].hi + pHVar3[lVar6].lo) <=
            (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6];
  }
  if (!(bool)(bVar4 | bVar5)) {
    return;
  }
LAB_00294b8e:
  __position._M_current =
       (this->propagateinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->propagateinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_14 = row;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->propagateinds_,__position,&local_14);
    lVar6 = (long)local_14;
    puVar7 = (this->propagateflags_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    *__position._M_current = row;
    (this->propagateinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  puVar7[lVar6] = '\x01';
  return;
}

Assistant:

void HighsDomain::markPropagate(HighsInt row) {
  if (!propagateflags_[row]) {
    bool proplower = mipsolver->rowLower(row) != -kHighsInf &&
                     (activitymininf_[row] != 0 ||
                      activitymin_[row] < mipsolver->rowLower(row) -
                                              mipsolver->mipdata_->feastol) &&
                     (activitymaxinf_[row] == 1 ||
                      (double(activitymax_[row]) - mipsolver->rowLower(row)) <=
                          capacityThreshold_[row]);
    bool propupper = mipsolver->rowUpper(row) != kHighsInf &&
                     (activitymaxinf_[row] != 0 ||
                      activitymax_[row] > mipsolver->rowUpper(row) +
                                              mipsolver->mipdata_->feastol) &&
                     (activitymininf_[row] == 1 ||
                      (mipsolver->rowUpper(row) - double(activitymin_[row])) <=
                          capacityThreshold_[row]);

    if (proplower || propupper) {
      propagateinds_.push_back(row);
      propagateflags_[row] = 1;
    }
  }
}